

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_template.h
# Opt level: O1

uint32_t helper_atomic_xchgb_ppc64
                   (CPUArchState_conflict23 *env,target_ulong addr,uint32_t val,TCGMemOpIdx oi)

{
  byte bVar1;
  byte *pbVar2;
  uintptr_t unaff_retaddr;
  
  pbVar2 = (byte *)atomic_mmu_lookup(env,addr,oi,unaff_retaddr);
  bVar1 = *pbVar2;
  *pbVar2 = (byte)val;
  return (uint)bVar1;
}

Assistant:

ABI_TYPE ATOMIC_NAME(xchg)(CPUArchState *env, target_ulong addr,
                           ABI_TYPE val EXTRA_ARGS)
{
    ATOMIC_MMU_DECLS;
    DATA_TYPE *haddr = ATOMIC_MMU_LOOKUP;
    DATA_TYPE ret;

    ret = *haddr;
    *haddr = val;
    ATOMIC_MMU_CLEANUP;

    return ret;
}